

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

int Wlc_NtkCollectObjs_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vObjs)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = *(ushort *)pObj;
  iVar2 = 0;
  if (-1 < (char)uVar1 && (uVar1 & 0x3d) != 1) {
    *(ushort *)pObj = uVar1 | 0x80;
    uVar5 = (ulong)pObj->nFanins;
    if ((int)pObj->nFanins < 1) {
      iVar2 = 0;
    }
    else {
      lVar6 = 0;
      iVar2 = 0;
      do {
        if ((2 < (uint)uVar5) ||
           (paVar4 = &pObj->field_10,
           (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
           (undefined1  [24])0x6)) {
          paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
        }
        iVar3 = paVar4->Fanins[lVar6];
        if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        iVar3 = Wlc_NtkCollectObjs_rec(p,p->pObjs + iVar3,vObjs);
        iVar2 = iVar2 + iVar3;
        lVar6 = lVar6 + 1;
        uVar5 = (ulong)(int)pObj->nFanins;
      } while (lVar6 < (long)uVar5);
    }
    Vec_IntPush(vObjs,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
    iVar2 = (uint)((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
                  (undefined1  [24])0x2d) + iVar2;
  }
  return iVar2;
}

Assistant:

int Wlc_NtkCollectObjs_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vObjs )
{
    int i, iFanin, Count = 0;
    if ( Wlc_ObjIsCi(pObj) )
        return 0;
    if ( pObj->Mark )
        return 0;
    pObj->Mark = 1;
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Count += Wlc_NtkCollectObjs_rec( p, Wlc_NtkObj(p, iFanin), vObjs );
    Vec_IntPush( vObjs, Wlc_ObjId(p, pObj) );
    return Count + (int)(pObj->Type == WLC_OBJ_ARI_MULTI);
}